

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  short sVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImGuiWindow **ppIVar10;
  ImGuiWindow *pIVar11;
  undefined1 uVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  bool bVar20;
  byte bVar21;
  byte bVar22;
  ImGuiWindow *pIVar23;
  ImGuiWindow *pIVar24;
  float fVar25;
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  ImGuiWindow *local_90;
  ImGuiViewportP *local_88;
  ImRect local_78;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar8 = GImGui;
  pIVar24 = GImGui->MovingWindow;
  if (pIVar24 == (ImGuiWindow *)0x0) {
    local_88 = (ImGuiViewportP *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  else {
    local_88 = pIVar24->Viewport;
    pIVar24->Viewport = GImGui->MouseViewport;
    pIVar23 = (ImGuiWindow *)0x0;
    if ((pIVar24->Flags & 0x200) == 0) {
      pIVar23 = pIVar24;
    }
  }
  local_68 = (pIVar8->Style).TouchExtraPadding;
  local_58._8_8_ = 0;
  local_58._0_4_ = local_68.x;
  local_58._4_4_ = local_68.y;
  if ((pIVar8->IO).ConfigWindowsResizeFromEdges == true) {
    auVar26 = maxps(local_58,_DAT_0018ea30);
    local_68 = auVar26._0_8_;
  }
  uStack_60 = 0;
  p = &(pIVar8->IO).MousePos;
  local_90 = (ImGuiWindow *)0x0;
  iVar16 = (pIVar8->Windows).Size;
LAB_001206fd:
  do {
    do {
      iVar15 = iVar16;
      if (iVar15 < 1) {
        pIVar8->HoveredWindow = pIVar23;
        if (pIVar23 == (ImGuiWindow *)0x0) {
          pIVar23 = (ImGuiWindow *)0x0;
          pIVar24 = (ImGuiWindow *)0x0;
        }
        else {
LAB_00120887:
          pIVar24 = pIVar23->RootWindow;
        }
        pIVar8->HoveredRootWindow = pIVar24;
        pIVar8->HoveredWindowUnderMovingWindow = local_90;
        pIVar11 = pIVar8->MovingWindow;
        if (pIVar11 != (ImGuiWindow *)0x0) {
          pIVar11->Viewport = local_88;
        }
        if ((pIVar23 != pIVar11 && pIVar23 != (ImGuiWindow *)0x0) &&
           (pIVar23->Viewport != pIVar8->MouseViewport)) {
          __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0xf16,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
        }
        pIVar11 = GetTopMostPopupModal();
        bVar9 = false;
        if ((pIVar11 != (ImGuiWindow *)0x0) && (bVar9 = false, pIVar24 != (ImGuiWindow *)0x0)) {
          bVar9 = IsWindowChildOf(pIVar24,pIVar11);
          bVar9 = !bVar9;
        }
        uVar13 = (pIVar8->IO).ConfigFlags;
        uVar17 = 0xffffffffffffffff;
        uVar19 = 0;
        bVar14 = 0;
        while( true ) {
          iVar16 = (int)uVar17;
          if (uVar19 == 5) break;
          if ((pIVar8->IO).MouseClicked[uVar19] == true) {
            bVar20 = true;
            if (pIVar23 == (ImGuiWindow *)0x0) {
              bVar20 = 0 < (pIVar8->OpenPopupStack).Size;
            }
            (pIVar8->IO).MouseDownOwned[uVar19] = bVar20;
          }
          bVar20 = (pIVar8->IO).MouseDown[uVar19];
          if ((bVar20 == true) &&
             ((iVar16 == -1 ||
              (dVar2 = (pIVar8->IO).MouseClickedTime[iVar16],
              pdVar1 = (pIVar8->IO).MouseClickedTime + uVar19, *pdVar1 <= dVar2 && dVar2 != *pdVar1)
              ))) {
            uVar17 = uVar19 & 0xffffffff;
          }
          bVar14 = bVar14 & 1 | bVar20;
          uVar19 = uVar19 + 1;
        }
        bVar22 = 1;
        bVar18 = 1;
        if (iVar16 != -1) {
          bVar18 = (pIVar8->IO).MouseDownOwned[iVar16];
        }
        bVar21 = (byte)((uVar13 & 0x10) >> 4) | bVar9;
        if (pIVar8->DragDropActive == true) {
          bVar22 = (pIVar8->DragDropSourceFlags & 0x10U) == 0 | bVar21;
        }
        if (bVar18 != 0) {
          bVar22 = bVar21;
        }
        if (bVar22 != 0) {
          pIVar8->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
          pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
          pIVar23 = (ImGuiWindow *)0x0;
        }
        if (pIVar8->WantCaptureMouseNextFrame == -1) {
          bVar9 = true;
          if ((bVar18 & (pIVar23 != (ImGuiWindow *)0x0 | bVar14)) == 0) {
            bVar9 = 0 < (pIVar8->OpenPopupStack).Size;
          }
          (pIVar8->IO).WantCaptureMouse = bVar9;
        }
        else {
          (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
        }
        if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
          bVar9 = pIVar8->ActiveId != 0 || pIVar11 != (ImGuiWindow *)0x0;
        }
        else {
          bVar9 = pIVar8->WantCaptureKeyboardNextFrame != 0;
        }
        uVar13 = uVar13 & 9;
        uVar12 = (char)uVar13;
        if (uVar13 != 1) {
          uVar12 = bVar9;
        }
        if ((pIVar8->IO).NavActive == false) {
          uVar12 = bVar9;
        }
        (pIVar8->IO).WantCaptureKeyboard = (bool)uVar12;
        (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
        return;
      }
      iVar16 = iVar15 + -1;
      ppIVar10 = ImVector<ImGuiWindow_*>::operator[](&pIVar8->Windows,iVar16);
      pIVar24 = *ppIVar10;
    } while (((pIVar24->Active != true) || (pIVar24->Hidden != false)) ||
            ((pIVar24->Flags & 0x200) != 0));
    if (pIVar24->Viewport == (ImGuiViewportP *)0x0) {
      __assert_fail("window->Viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1256,"void FindHoveredWindow()");
    }
  } while (pIVar24->Viewport != pIVar8->MouseViewport);
  IVar6 = (pIVar24->OuterRectClipped).Min;
  IVar7 = (pIVar24->OuterRectClipped).Max;
  uVar13 = (uint)((pIVar24->Flags & 0x1000042U) == 0);
  auVar27._0_4_ = (int)(uVar13 << 0x1f) >> 0x1f;
  auVar27._4_4_ = (int)(uVar13 << 0x1f) >> 0x1f;
  auVar27._8_8_ = 0;
  auVar26._8_8_ = uStack_60;
  auVar26._0_4_ = local_68.x;
  auVar26._4_4_ = local_68.y;
  auVar28 = ~auVar27 & local_58 | auVar26 & auVar27;
  fVar25 = auVar28._0_4_;
  fVar29 = auVar28._4_4_;
  auVar4._4_8_ = SUB168(auVar26 & auVar27,8);
  auVar4._0_4_ = fVar29;
  auVar28._0_8_ = auVar4._0_8_ << 0x20;
  auVar28._8_4_ = fVar25;
  auVar28._12_4_ = fVar29;
  local_78.Min.x = IVar6.x;
  local_78.Min.y = IVar6.y;
  local_78.Max.x = IVar7.x;
  local_78.Max.y = IVar7.y;
  auVar5._4_8_ = auVar28._8_8_;
  auVar5._0_4_ = fVar29 + local_78.Min.y;
  auVar30._0_8_ = auVar5._0_8_ << 0x20;
  auVar30._8_4_ = fVar25 + local_78.Max.x;
  auVar30._12_4_ = fVar29 + local_78.Max.y;
  local_78.Max = auVar30._8_8_;
  local_78.Min.y = local_78.Min.y - fVar29;
  local_78.Min.x = local_78.Min.x - fVar25;
  bVar9 = ImRect::Contains(&local_78,p);
  if (bVar9) {
    sVar3 = (pIVar24->HitTestHoleSize).x;
    if (sVar3 != 0) {
      auVar26 = pshuflw(ZEXT416((uint)pIVar24->HitTestHoleOffset),
                        ZEXT416((uint)pIVar24->HitTestHoleOffset),0x60);
      local_40.Min.x = (float)(auVar26._0_4_ >> 0x10) + (pIVar24->Pos).x;
      local_40.Min.y = (float)(auVar26._4_4_ >> 0x10) + (pIVar24->Pos).y;
      local_40.Max.x = (float)(int)sVar3 + local_40.Min.x;
      local_40.Max.y =
           (float)(int)((long)((ulong)(ushort)(pIVar24->HitTestHoleSize).y << 0x30) >> 0x30) +
           local_40.Min.y;
      bVar9 = ImRect::Contains(&local_40,p);
      if (bVar9) goto LAB_001206fd;
    }
    if (pIVar23 == (ImGuiWindow *)0x0) {
      pIVar23 = pIVar24;
    }
    if (((local_90 == (ImGuiWindow *)0x0) &&
        (local_90 = pIVar24, pIVar8->MovingWindow != (ImGuiWindow *)0x0)) &&
       (pIVar24->RootWindow == pIVar8->MovingWindow->RootWindow)) {
      local_90 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar23 != (ImGuiWindow *)0x0) {
        pIVar8->HoveredWindow = pIVar23;
        goto LAB_00120887;
      }
      pIVar23 = (ImGuiWindow *)0x0;
    }
  }
  iVar16 = iVar15 + -1;
  goto LAB_001206fd;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}